

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

pointer __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
create_array<std::initializer_list<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          allocator_type *alloc,
          initializer_list<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *args)

{
  pointer_conflict ptr_00;
  pointer ptr;
  stor_allocator_type stor_alloc;
  json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  *in_stack_ffffffffffffffa8;
  allocator_type *in_stack_ffffffffffffffb0;
  
  std::
  allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>_>
  ::allocator<char>(in_stack_ffffffffffffffb0,(allocator<char> *)in_stack_ffffffffffffffa8);
  ptr_00 = std::
           allocator_traits<std::allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>_>_>
           ::allocate(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
  ext_traits::
  to_plain_pointer<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>>
            (ptr_00);
  std::
  allocator_traits<std::allocator<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>>>
  ::
  construct<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>,std::initializer_list<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (initializer_list<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)0x33cca3);
  std::
  allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>_>
  ::~allocator((allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
                *)0x33cd17);
  return ptr_00;
}

Assistant:

typename array_storage::pointer create_array(const allocator_type& alloc, Args&& ... args)
        {
            using stor_allocator_type = typename array_storage::allocator_type;
            stor_allocator_type stor_alloc(alloc);
            auto ptr = std::allocator_traits<stor_allocator_type>::allocate(stor_alloc, 1);
            JSONCONS_TRY
            {
                std::allocator_traits<stor_allocator_type>::construct(stor_alloc, ext_traits::to_plain_pointer(ptr), 
                    std::forward<Args>(args)...);
            }